

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O0

int write_s98v1(s98c *ctx,FILE *fp)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  char *__s;
  size_t sVar3;
  uint32_t uVar4;
  int local_70;
  undefined1 local_68 [8];
  char zero [40];
  uint32_t local_34;
  int dump_length;
  int loop_offset;
  int dump_offset;
  int tag_length;
  char *title;
  int header_size;
  FILE *fp_local;
  s98c *ctx_local;
  
  __s = find_tag_value(ctx,"title");
  if (__s == (char *)0x0) {
    local_70 = 0;
  }
  else {
    sVar3 = strlen(__s);
    local_70 = (int)sVar3 + 1;
  }
  dump_length = local_70 + 0x40;
  local_34 = 0;
  puVar1 = ctx->p;
  puVar2 = ctx->dump_buffer;
  if (dump_length < 0x80) {
    dump_length = 0x80;
  }
  if (ctx->loop_start != (uint8_t *)0x0) {
    local_34 = dump_length + ((int)ctx->loop_start - (int)ctx->dump_buffer);
  }
  if (ctx->dump_start != (uint8_t *)0x0) {
    dump_length = dump_length + ((int)ctx->dump_start - (int)ctx->dump_buffer);
  }
  uVar4 = 0x40;
  if (__s == (char *)0x0) {
    uVar4 = 0;
  }
  (ctx->header).offset_to_tag = uVar4;
  (ctx->header).offset_to_dump = dump_length;
  (ctx->header).offset_to_loop = local_34;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  write_dword(fp,(ctx->header).timer_numerator);
  write_dword(fp,0);
  write_dword(fp,0);
  write_dword(fp,0x40);
  write_dword(fp,(ctx->header).offset_to_dump);
  write_dword(fp,(ctx->header).offset_to_loop);
  memset(local_68,0,0x28);
  fwrite(local_68,1,0x24,(FILE *)fp);
  if (0 < local_70) {
    fwrite(__s,1,(long)local_70,(FILE *)fp);
  }
  fwrite(local_68,1,(long)(0x40 - local_70),(FILE *)fp);
  fwrite(ctx->dump_buffer,1,(long)((int)puVar1 - (int)puVar2),(FILE *)fp);
  return 0;
}

Assistant:

int write_s98v1(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x40; 
    char* title = find_tag_value(ctx, "title");
    int tag_length = (title == NULL) ? 0 : strlen(title) + 1;
    int dump_offset = header_size + tag_length; // where dump bytes *REALLY* starts
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;

    if(dump_offset < 0x80) dump_offset = 0x80;
    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = (title == NULL) ? 0 : 0x40;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, 0); // 8
    write_dword(fp, 0); // c
    write_dword(fp, 0x40); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18

    char zero[40];
    memset(zero, 0, sizeof zero);
    fwrite(zero, 1, 36, fp);

    if(tag_length > 0) {
        fwrite(title, 1, tag_length, fp);
    }
        
    fwrite(zero, 1, 0x40 - tag_length, fp);

    fwrite(ctx->dump_buffer, 1, dump_length, fp);

    return 0;
}